

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O3

DistanceGraph * __thiscall
WorkSpace::add_distance_graph(WorkSpace *this,DistanceGraph *dg,string *name)

{
  vector<DistanceGraph,_std::allocator<DistanceGraph>_> *this_00;
  pointer pcVar1;
  long *plVar2;
  WorkSpace *pWVar3;
  int iVar4;
  runtime_error *prVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  WorkSpace *local_58;
  DistanceGraph *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_50 = dg;
  if (0x1900 < (ulong)((long)(this->distance_graphs).
                             super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->distance_graphs).
                            super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,
               "Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items"
              );
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58 = this;
  list_distance_graphs_abi_cxx11_(&local_48,this);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar6 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + pbVar6->_M_string_length);
      plVar2 = local_78;
      if ((local_70 == name->_M_string_length) &&
         ((local_70 == 0 || (iVar4 = bcmp(local_78,(name->_M_dataplus)._M_p,local_70), iVar4 == 0)))
         ) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Name is already in use");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (plVar2 != local_68) {
        operator_delete(plVar2,local_68[0] + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pWVar3 = local_58;
  this_00 = &local_58->distance_graphs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::vector<DistanceGraph,std::allocator<DistanceGraph>>::emplace_back<DistanceGraph_const&>
            ((vector<DistanceGraph,std::allocator<DistanceGraph>> *)this_00,local_50);
  if (name->_M_string_length != 0) {
    std::__cxx11::string::_M_assign
              ((string *)
               &(pWVar3->distance_graphs).
                super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].name);
  }
  return (pWVar3->distance_graphs).super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

DistanceGraph &WorkSpace::add_distance_graph(const DistanceGraph &dg, const std::string &name) {
    if (distance_graphs.size() > MAX_WORKSPACE_VECTOR_SIZE) {
        throw std::runtime_error("Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items");
    }
    for (auto n:list_distance_graphs()) if (n==name) throw std::runtime_error("Name is already in use");
    distance_graphs.emplace_back(dg);
    if (!name.empty()) distance_graphs.back().name = name;
    return distance_graphs.back();
}